

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void term_print_flush(Terminal *term)

{
  size_t sVar1;
  undefined1 local_28 [8];
  ptrlen data;
  size_t size;
  Terminal *term_local;
  
  while( true ) {
    sVar1 = bufchain_size(&term->printer_buf);
    if (sVar1 < 6) break;
    _local_28 = bufchain_prefix(&term->printer_buf);
    if ((void *)(sVar1 - 5) < data.ptr) {
      data.ptr = (void *)(sVar1 - 5);
    }
    printer_job_data(term->print_job,(void *)local_28,(size_t)data.ptr);
    bufchain_consume(&term->printer_buf,(size_t)data.ptr);
  }
  return;
}

Assistant:

static void term_print_flush(Terminal *term)
{
    size_t size;
    while ((size = bufchain_size(&term->printer_buf)) > 5) {
        ptrlen data = bufchain_prefix(&term->printer_buf);
        if (data.len > size-5)
            data.len = size-5;
        printer_job_data(term->print_job, data.ptr, data.len);
        bufchain_consume(&term->printer_buf, data.len);
    }
}